

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cli::Parser::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Parser *this,string *name)

{
  pointer ppCVar1;
  CmdBase *pCVar2;
  __type _Var3;
  runtime_error *prVar4;
  pointer ppCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ppCVar5 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppCVar5 == ppCVar1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_68,"The parameter ",name);
      std::operator+(&local_48,&bStack_68," could not be found.");
      std::runtime_error::runtime_error(prVar4,(string *)&local_48);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    _Var3 = std::operator==(&(*ppCVar5)->name,name);
    if (_Var3) break;
    ppCVar5 = ppCVar5 + 1;
  }
  pCVar2 = *ppCVar5;
  if ((pCVar2 != (CmdBase *)0x0) &&
     (pCVar2->_vptr_CmdBase == (_func_int **)&PTR__CmdArgument_001388d8)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(pCVar2 + 1));
    return __return_storage_ptr__;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_68,"Invalid usage of the parameter ",name);
  std::operator+(&local_48,&bStack_68," detected.");
  std::runtime_error::runtime_error(prVar4,(string *)&local_48);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T get(const std::string& name) const {
			for (const auto& command : _commands) {
				if (command->name == name) {
					auto cmd = dynamic_cast<CmdArgument<T>*>(command);

					if (cmd == nullptr) {
						throw std::runtime_error("Invalid usage of the parameter " + name + " detected.");
					}

					return cmd->value;
				}
			}

			throw std::runtime_error("The parameter " + name + " could not be found.");
		}